

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-reader.h
# Opt level: O3

void __thiscall
mp::internal::
NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,mp::internal::NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>>>>
::ReadLinearExpr<mp::BasicProblem<mp::BasicProblemParams<int>>::LinearExprBuilder>
          (NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,mp::internal::NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>>>>
           *this,int num_terms,LinearExprBuilder linear_expr)

{
  BinaryReaderBase *this_00;
  int iVar1;
  double *pdVar2;
  Term local_38;
  
  if (0 < num_terms) {
    do {
      iVar1 = NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,_mp::internal::NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
              ::ReadUInt((NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,_mp::internal::NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
                          *)this,**(uint **)(this + 8));
      this_00 = *(BinaryReaderBase **)this;
      (this_00->super_ReaderBase).token_ = (this_00->super_ReaderBase).ptr_;
      pdVar2 = (double *)BinaryReaderBase::Read(this_00,8);
      local_38.coef_ = *pdVar2;
      local_38.var_index_ = iVar1;
      gch::detail::small_vector_base<std::allocator<mp::LinearExpr::Term>,_6U>::
      append_element<mp::LinearExpr::Term>
                ((small_vector_base<std::allocator<mp::LinearExpr::Term>,_6U> *)linear_expr.expr_,
                 &local_38);
      num_terms = num_terms + -1;
    } while (num_terms != 0);
  }
  return;
}

Assistant:

void NLReader<Reader, Handler>::ReadLinearExpr(
    int num_terms, LinearHandler linear_expr) {
  for (int i = 0; i < num_terms; ++i) {
    // Variable index should be less than num_vars because common
    // expressions are not allowed in a linear expression.
    int var_index = ReadUInt(header_.num_vars);
    double coef = reader_.ReadDouble();
    reader_.ReadTillEndOfLine();
    linear_expr.AddTerm(var_index, coef);
  }
}